

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketInitiator.cpp
# Opt level: O0

void __thiscall FIX::SocketInitiator::doConnect(SocketInitiator *this,SessionID *s,Dictionary *d)

{
  socket_handle s_00;
  Log *pLVar1;
  bool bVar2;
  Session *this_00;
  SocketConnection *this_01;
  SocketMonitor *pMonitor;
  mapped_type *ppSVar3;
  signed_int value;
  signed_int value_00;
  exception *anon_var_0;
  undefined1 local_1f0 [4];
  socket_handle result;
  string local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  Log *local_b0;
  Log *log;
  UtcTimeStamp local_a0;
  Session *local_78;
  Session *session;
  undefined1 local_68 [6];
  short sourcePort;
  string sourceAddress;
  undefined1 local_40 [6];
  short port;
  string address;
  Dictionary *d_local;
  SessionID *s_local;
  SocketInitiator *this_local;
  
  address.field_2._8_8_ = d;
  std::__cxx11::string::string((string *)local_40);
  sourceAddress.field_2._14_2_ = 0;
  std::__cxx11::string::string((string *)local_68);
  session._6_2_ = 0;
  this_00 = Session::lookupSession(s);
  local_78 = this_00;
  UtcTimeStamp::UtcTimeStamp(&local_a0);
  bVar2 = Session::isSessionTime(this_00,&local_a0);
  UtcTimeStamp::~UtcTimeStamp(&local_a0);
  bVar2 = ((bVar2 ^ 0xffU) & 1) != 0;
  if (!bVar2) {
    local_b0 = Session::getLog(local_78);
    getHost(this,s,(Dictionary *)address.field_2._8_8_,(string *)local_40,
            (short *)(sourceAddress.field_2._M_local_buf + 0xe),(string *)local_68,
            (short *)((long)&session + 6));
    pLVar1 = local_b0;
    std::operator+(&local_1b0,"Connecting to ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    std::operator+(&local_190,&local_1b0," on port ");
    IntConvertor::convert_abi_cxx11_
              (&local_1d0,(IntConvertor *)(ulong)(ushort)sourceAddress.field_2._14_2_,value);
    std::operator+(&local_170,&local_190,&local_1d0);
    std::operator+(&local_150,&local_170," (Source ");
    std::operator+(&local_130,&local_150,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
    std::operator+(&local_110,&local_130,":");
    IntConvertor::convert_abi_cxx11_
              ((string *)local_1f0,(IntConvertor *)(ulong)session._6_2_,value_00);
    std::operator+(&local_f0,&local_110,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0);
    std::operator+(&local_d0,&local_f0,")");
    (*pLVar1->_vptr_Log[6])(pLVar1,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)local_1f0);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_1b0);
    anon_var_0._4_4_ =
         SocketConnector::connect
                   (&this->m_connector,(int)local_40,
                    (sockaddr *)(ulong)(uint)(int)(short)sourceAddress.field_2._14_2_,
                    this->m_noDelay & 1);
    Initiator::setPending(&this->super_Initiator,s);
    this_01 = (SocketConnection *)operator_new(0x2180);
    s_00 = anon_var_0._4_4_;
    pMonitor = SocketConnector::getMonitor(&this->m_connector);
    SocketConnection::SocketConnection(this_01,this,s,s_00,pMonitor);
    ppSVar3 = std::
              map<int,_FIX::SocketConnection_*,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
              ::operator[](&this->m_pendingConnections,(key_type *)((long)&anon_var_0 + 4));
    *ppSVar3 = this_01;
  }
  log._4_4_ = (uint)bVar2;
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void SocketInitiator::doConnect( const SessionID& s, const Dictionary& d )
{
  try
  {
    std::string address;
    short port = 0;
    std::string sourceAddress;
    short sourcePort = 0;

    Session* session = Session::lookupSession( s );
    if( !session->isSessionTime(UtcTimeStamp()) ) return;

    Log* log = session->getLog();

    getHost( s, d, address, port, sourceAddress, sourcePort );

    log->onEvent( "Connecting to " + address + " on port " + IntConvertor::convert((unsigned short)port) + " (Source " + sourceAddress + ":" + IntConvertor::convert((unsigned short)sourcePort) + ")");
    socket_handle result = m_connector.connect( address, port, m_noDelay, m_sendBufSize, m_rcvBufSize, sourceAddress, sourcePort );
    setPending( s );

    m_pendingConnections[ result ] 
      = new SocketConnection( *this, s, result, &m_connector.getMonitor() );
  }
  catch ( std::exception& ) {}
}